

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# untyped_message.cc
# Opt level: O3

Status __thiscall
google::protobuf::json_internal::MakeInvalidLengthDelimType
          (json_internal *this,int kind,int field_number)

{
  uintptr_t extraout_RAX;
  Status SVar1;
  long *local_50;
  undefined8 local_48;
  long local_40 [2];
  ulong local_30;
  code *local_28;
  ulong local_20;
  code *local_18;
  
  local_30 = (ulong)(uint)kind;
  local_28 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
  local_20 = (ulong)(uint)field_number;
  local_18 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
  absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
            (&local_50,"field type %d (number %d) does not support type 2 records",0x39,&local_30,2)
  ;
  absl::lts_20240722::InvalidArgumentError(this,local_48,local_50);
  SVar1.rep_ = (uintptr_t)local_40;
  if (local_50 != (long *)SVar1.rep_) {
    operator_delete(local_50,local_40[0] + 1);
    SVar1.rep_ = extraout_RAX;
  }
  return (Status)SVar1.rep_;
}

Assistant:

PROTOBUF_NOINLINE static absl::Status MakeInvalidLengthDelimType(
    int kind, int field_number) {
  return absl::InvalidArgumentError(absl::StrFormat(
      "field type %d (number %d) does not support type 2 records", kind,
      field_number));
}